

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Instr * __thiscall GlobOpt::TrackMarkTempObject(GlobOpt *this,Instr *instrStart,Instr *instrLast)

{
  Instr *pIVar1;
  Instr *pIVar2;
  bool bVar3;
  bool bVar4;
  GlobOptBlockData *pGVar5;
  Opnd *pOVar6;
  RegOpnd *opnd;
  Opnd *dst;
  Opnd *src2;
  Opnd *src1;
  bool mayNeedBailOnImplicitCallsPreOp;
  GlobOptBlockData *globOptData;
  Instr *lastInstr;
  Instr *instrEnd;
  Instr *instr;
  Instr *instrLast_local;
  Instr *instrStart_local;
  GlobOpt *this_local;
  
  bVar3 = Func::GetHasMarkTempObjects(this->func);
  this_local = (GlobOpt *)instrLast;
  if (bVar3) {
    pIVar1 = instrLast->m_next;
    pGVar5 = CurrentBlockData(this);
    pIVar2 = instrStart;
    do {
      instrEnd = pIVar2;
      bVar4 = IsLoopPrePass(this);
      bVar3 = false;
      if (!bVar4) {
        bVar4 = IR::Instr::HasAnyImplicitCalls(instrEnd);
        bVar3 = false;
        if (bVar4) {
          bVar3 = pGVar5->maybeTempObjectSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0;
        }
      }
      if ((bVar3) && (pOVar6 = IR::Instr::GetSrc1(instrEnd), pOVar6 != (Opnd *)0x0)) {
        instrEnd = GenerateBailOutMarkTempObjectIfNeeded(this,instrEnd,pOVar6,false);
        pOVar6 = IR::Instr::GetSrc2(instrEnd);
        if (pOVar6 != (Opnd *)0x0) {
          instrEnd = GenerateBailOutMarkTempObjectIfNeeded(this,instrEnd,pOVar6,false);
        }
      }
      pOVar6 = IR::Instr::GetDst(instrEnd);
      if (pOVar6 != (Opnd *)0x0) {
        bVar4 = IR::Opnd::IsRegOpnd(pOVar6);
        if (bVar4) {
          opnd = IR::Opnd::AsRegOpnd(pOVar6);
          TrackTempObjectSyms(this,instrEnd,opnd);
        }
        else if (bVar3) {
          instrEnd = GenerateBailOutMarkTempObjectIfNeeded(this,instrEnd,pOVar6,true);
        }
      }
      pIVar2 = instrEnd->m_next;
    } while (instrEnd->m_next != pIVar1);
    this_local = (GlobOpt *)instrEnd;
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
GlobOpt::TrackMarkTempObject(IR::Instr * instrStart, IR::Instr * instrLast)
{
    if (!this->func->GetHasMarkTempObjects())
    {
        return instrLast;
    }
    IR::Instr * instr = instrStart;
    IR::Instr * instrEnd = instrLast->m_next;
    IR::Instr * lastInstr = nullptr;
    GlobOptBlockData& globOptData = *CurrentBlockData();
    do
    {
        bool mayNeedBailOnImplicitCallsPreOp = !this->IsLoopPrePass()
            && instr->HasAnyImplicitCalls()
            && globOptData.maybeTempObjectSyms != nullptr;
        if (mayNeedBailOnImplicitCallsPreOp)
        {
            IR::Opnd * src1 = instr->GetSrc1();
            if (src1)
            {
                instr = GenerateBailOutMarkTempObjectIfNeeded(instr, src1, false);
                IR::Opnd * src2 = instr->GetSrc2();
                if (src2)
                {
                    instr = GenerateBailOutMarkTempObjectIfNeeded(instr, src2, false);
                }
            }
        }

        IR::Opnd *dst = instr->GetDst();
        if (dst)
        {
            if (dst->IsRegOpnd())
            {
                TrackTempObjectSyms(instr, dst->AsRegOpnd());
            }
            else if (mayNeedBailOnImplicitCallsPreOp)
            {
                instr = GenerateBailOutMarkTempObjectIfNeeded(instr, dst, true);
            }
        }

        lastInstr = instr;
        instr = instr->m_next;
    }
    while (instr != instrEnd);
    return lastInstr;
}